

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

_Bool termchars_equal_override(termchar *a,termchar *b,unsigned_long bchr,unsigned_long battr)

{
  termchar *ptVar1;
  termchar *ptVar2;
  wchar_t wVar3;
  long lVar4;
  
  if (((((((a->truecolour).fg.enabled == (b->truecolour).fg.enabled) &&
         ((a->truecolour).fg.r == (b->truecolour).fg.r)) &&
        ((a->truecolour).fg.g == (b->truecolour).fg.g)) &&
       (((a->truecolour).fg.b == (b->truecolour).fg.b &&
        ((a->truecolour).bg.enabled == (b->truecolour).bg.enabled)))) &&
      (((a->truecolour).bg.r == (b->truecolour).bg.r &&
       (((a->truecolour).bg.g == (b->truecolour).bg.g &&
        ((a->truecolour).bg.b == (b->truecolour).bg.b)))))) &&
     ((a->chr == bchr && (((battr ^ a->attr) & 0xffffffff0fffffff) == 0)))) {
    do {
      lVar4 = (long)a->cc_next;
      wVar3 = b->cc_next;
      if ((lVar4 == 0) || (wVar3 == L'\0')) {
        return a->cc_next == L'\0' && wVar3 == L'\0';
      }
      ptVar1 = a + lVar4;
      a = a + lVar4;
      ptVar2 = b + wVar3;
      b = b + wVar3;
    } while (ptVar1->chr == ptVar2->chr);
  }
  return false;
}

Assistant:

static bool termchars_equal_override(termchar *a, termchar *b,
                                     unsigned long bchr, unsigned long battr)
{
    /* FULL-TERMCHAR */
    if (!truecolour_equal(a->truecolour, b->truecolour))
        return false;
    if (a->chr != bchr)
        return false;
    if ((a->attr &~ DATTR_MASK) != (battr &~ DATTR_MASK))
        return false;
    while (a->cc_next || b->cc_next) {
        if (!a->cc_next || !b->cc_next)
            return false;              /* one cc-list ends, other does not */
        a += a->cc_next;
        b += b->cc_next;
        if (a->chr != b->chr)
            return false;
    }
    return true;
}